

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
maxPrescaledRatio<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *coScaleval,bool rowRatio)

{
  double a;
  byte bVar1;
  uint uVar2;
  int32_t iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  undefined4 extraout_var;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *extraout_RAX;
  undefined4 extraout_var_00;
  soplex *psVar6;
  long lVar7;
  fpclass_type fVar8;
  long lVar9;
  uint *puVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  long lVar14;
  long *plVar15;
  long in_FS_OFFSET;
  bool bVar16;
  byte bVar17;
  Real a_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mini;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  uint local_308 [3];
  undefined3 uStack_2fb;
  int iStack_2f8;
  bool bStack_2f4;
  undefined8 local_2f0;
  ulong local_2e0;
  long local_2d8;
  long local_2d0;
  ulong local_2c8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_2c0;
  cpp_dec_float<200U,_int,_void> local_2b8;
  cpp_dec_float<200U,_int,_void> local_238;
  cpp_dec_float<200U,_int,_void> local_1b8;
  fpclass_type local_138;
  int32_t iStack_134;
  undefined8 uStack_130;
  cpp_dec_float<200U,_int,_void> local_120;
  uint local_a0 [28];
  
  bVar17 = 0;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  local_2c0 = lp;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,0.0);
  psVar6 = this + 0x100;
  if ((int)coScaleval != 0) {
    psVar6 = this + 0x38;
  }
  uVar2 = *(uint *)psVar6;
  pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)(ulong)uVar2;
  if (0 < (int)uVar2) {
    a = *(double *)(in_FS_OFFSET + -8);
    local_2e0 = (ulong)uVar2;
    bVar16 = (char)coScaleval != '\0';
    local_2d0 = 0xe8;
    if (bVar16) {
      local_2d0 = 0x20;
    }
    local_2d8 = 0xf0;
    if (bVar16) {
      local_2d8 = 0x28;
    }
    local_2c8 = 0;
    do {
      plVar15 = (long *)((long)*(int *)(*(long *)(this + local_2d8) + 4 + local_2c8 * 8) * 0x28 +
                        *(long *)(this + local_2d0));
      ::soplex::infinity::__tls_init();
      local_238.fpclass = cpp_dec_float_finite;
      local_238.prec_elem = 0x1c;
      local_238.data._M_elems[0] = 0;
      local_238.data._M_elems[1] = 0;
      local_238.data._M_elems[2] = 0;
      local_238.data._M_elems[3] = 0;
      local_238.data._M_elems[4] = 0;
      local_238.data._M_elems[5] = 0;
      local_238.data._M_elems[6] = 0;
      local_238.data._M_elems[7] = 0;
      local_238.data._M_elems[8] = 0;
      local_238.data._M_elems[9] = 0;
      local_238.data._M_elems[10] = 0;
      local_238.data._M_elems[0xb] = 0;
      local_238.data._M_elems[0xc] = 0;
      local_238.data._M_elems[0xd] = 0;
      local_238.data._M_elems[0xe] = 0;
      local_238.data._M_elems[0xf] = 0;
      local_238.data._M_elems[0x10] = 0;
      local_238.data._M_elems[0x11] = 0;
      local_238.data._M_elems[0x12] = 0;
      local_238.data._M_elems[0x13] = 0;
      local_238.data._M_elems[0x14] = 0;
      local_238.data._M_elems[0x15] = 0;
      local_238.data._M_elems[0x16] = 0;
      local_238.data._M_elems[0x17] = 0;
      local_238.data._M_elems[0x18] = 0;
      local_238.data._M_elems[0x19] = 0;
      local_238.data._M_elems._104_5_ = 0;
      local_238.data._M_elems[0x1b]._1_3_ = 0;
      local_238.exp = 0;
      local_238.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_238,a);
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x1c;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems[0xe] = 0;
      local_1b8.data._M_elems[0xf] = 0;
      local_1b8.data._M_elems[0x10] = 0;
      local_1b8.data._M_elems[0x11] = 0;
      local_1b8.data._M_elems[0x12] = 0;
      local_1b8.data._M_elems[0x13] = 0;
      local_1b8.data._M_elems[0x14] = 0;
      local_1b8.data._M_elems[0x15] = 0;
      local_1b8.data._M_elems[0x16] = 0;
      local_1b8.data._M_elems[0x17] = 0;
      local_1b8.data._M_elems[0x18] = 0;
      local_1b8.data._M_elems[0x19] = 0;
      local_1b8.data._M_elems._104_5_ = 0;
      local_1b8.data._M_elems[0x1b]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_1b8,0.0);
      if (0 < *(int *)((long)plVar15 + 0xc)) {
        lVar14 = 0;
        lVar9 = 0;
        do {
          lVar7 = *plVar15;
          iVar4 = *(int *)(lVar7 + 0x70 + lVar14);
          bVar1 = *(byte *)(lVar7 + 0x74 + lVar14);
          fVar8 = *(fpclass_type *)(lVar7 + 0x78 + lVar14);
          iVar3 = *(int32_t *)(lVar7 + 0x7c + lVar14);
          memmove(local_368,(void *)(lVar7 + lVar14),0x70);
          iStack_2f8 = iVar4;
          bStack_2f4 = (bool)bVar1;
          local_2f0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(iVar3,fVar8);
          if ((bVar1 == 1) && (local_368._0_4_ != 0 || fVar8 != cpp_dec_float_finite)) {
            bStack_2f4 = false;
          }
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                    ((local_2c0->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._vptr_ClassArray + (ulong)*(uint *)(*plVar15 + 0x80 + lVar14) * 0x10);
          local_2b8.fpclass = cpp_dec_float_finite;
          local_2b8.prec_elem = 0x1c;
          local_2b8.data._M_elems[0] = 0;
          local_2b8.data._M_elems[1] = 0;
          local_2b8.data._M_elems[2] = 0;
          local_2b8.data._M_elems[3] = 0;
          local_2b8.data._M_elems[4] = 0;
          local_2b8.data._M_elems[5] = 0;
          local_2b8.data._M_elems[6] = 0;
          local_2b8.data._M_elems[7] = 0;
          local_2b8.data._M_elems[8] = 0;
          local_2b8.data._M_elems[9] = 0;
          local_2b8.data._M_elems[10] = 0;
          local_2b8.data._M_elems[0xb] = 0;
          local_2b8.data._M_elems[0xc] = 0;
          local_2b8.data._M_elems[0xd] = 0;
          local_2b8.data._M_elems[0xe] = 0;
          local_2b8.data._M_elems[0xf] = 0;
          local_2b8.data._M_elems[0x10] = 0;
          local_2b8.data._M_elems[0x11] = 0;
          local_2b8.data._M_elems[0x12] = 0;
          local_2b8.data._M_elems[0x13] = 0;
          local_2b8.data._M_elems[0x14] = 0;
          local_2b8.data._M_elems[0x15] = 0;
          local_2b8.data._M_elems[0x16] = 0;
          local_2b8.data._M_elems[0x17] = 0;
          local_2b8.data._M_elems[0x18] = 0;
          local_2b8.data._M_elems[0x19] = 0;
          local_2b8.data._M_elems._104_5_ = 0;
          local_2b8.data._M_elems[0x1b]._1_3_ = 0;
          local_2b8.exp = 0;
          local_2b8.neg = false;
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_368;
          if (&local_2b8 != pcVar13) {
            pcVar12 = &local_2b8;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pcVar12->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
              pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar17 * -8 + 4);
            }
            local_2b8.prec_elem = iVar3;
            local_2b8.fpclass = fVar8;
            pcVar11 = pcVar13;
            local_2b8.exp = iVar4;
            local_2b8.neg = bStack_2f4;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&local_2b8,pcVar11);
          bVar16 = local_2b8.neg;
          iVar4 = local_2b8.exp;
          pcVar11 = &local_2b8;
          puVar10 = local_a0;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar10 = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
            puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
          }
          local_138 = local_2b8.fpclass;
          iStack_134 = local_2b8.prec_elem;
          uStack_130 = 0;
          this_00 = *(Tolerances **)(this + 0x228);
          this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x230);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a_00 = Tolerances::epsilon(this_00);
          puVar10 = local_a0;
          pcVar11 = &local_120;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar10;
            puVar10 = puVar10 + (ulong)bVar17 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar17 * -2 + 1) * 4);
          }
          local_120.exp = iVar4;
          local_120.neg = bVar16;
          local_120.fpclass = local_138;
          local_120.prec_elem = iStack_134;
          if ((bVar16 != false) &&
             (local_120.data._M_elems[0] != 0 || local_138 != cpp_dec_float_finite)) {
            local_120.neg = (bool)(bVar16 ^ 1);
          }
          bVar16 = false;
          if ((local_138 != cpp_dec_float_NaN) && (!NAN(a_00))) {
            local_2f0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)0x1c00000000;
            local_368 = (undefined1  [16])0x0;
            local_358 = (undefined1  [16])0x0;
            local_348 = (undefined1  [16])0x0;
            local_338 = (undefined1  [16])0x0;
            local_328 = (undefined1  [16])0x0;
            local_318 = (undefined1  [16])0x0;
            local_308[0] = 0;
            local_308[1] = 0;
            stack0xfffffffffffffd00 = 0;
            uStack_2fb = 0;
            iStack_2f8 = 0;
            bStack_2f4 = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)local_368,a_00);
            iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_120,(cpp_dec_float<200U,_int,_void> *)local_368);
            bVar16 = iVar4 < 1;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (!bVar16) {
            fVar8 = local_2b8.fpclass;
            if ((local_2b8.fpclass != cpp_dec_float_NaN) && (local_238.fpclass != cpp_dec_float_NaN)
               ) {
              iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&local_2b8,&local_238);
              fVar8 = local_2b8.fpclass;
              if (iVar4 < 0) {
                pcVar11 = &local_2b8;
                pcVar13 = &local_238;
                for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                  (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                  pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar11 + (ulong)bVar17 * -8 + 4);
                  pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar13 + (ulong)bVar17 * -8 + 4);
                }
                local_238.exp = local_2b8.exp;
                local_238.neg = local_2b8.neg;
                local_238.fpclass = local_2b8.fpclass;
                local_238.prec_elem = local_2b8.prec_elem;
              }
            }
            if (((fVar8 != cpp_dec_float_NaN) && (local_1b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_2b8,&local_1b8), 0 < iVar4)) {
              pcVar11 = &local_2b8;
              pcVar13 = &local_1b8;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4)
                ;
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar17 * -8 + 4)
                ;
              }
              local_1b8.exp = local_2b8.exp;
              local_1b8.neg = local_2b8.neg;
              local_1b8.fpclass = local_2b8.fpclass;
              local_1b8.prec_elem = local_2b8.prec_elem;
            }
          }
          lVar9 = lVar9 + 1;
          lVar14 = lVar14 + 0x84;
        } while (lVar9 < *(int *)((long)plVar15 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      local_2f0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)0x1c00000000;
      local_368 = ZEXT816(0);
      local_358 = ZEXT816(0);
      local_348 = ZEXT816(0);
      local_338 = ZEXT816(0);
      local_328 = ZEXT816(0);
      local_318 = ZEXT816(0);
      local_308[0] = 0;
      local_308[1] = 0;
      stack0xfffffffffffffd00 = 0;
      uStack_2fb = 0;
      iStack_2f8 = 0;
      bStack_2f4 = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)local_368,a);
      if ((local_238.fpclass == cpp_dec_float_NaN) || ((fpclass_type)local_2f0 == cpp_dec_float_NaN)
         ) {
LAB_00149941:
        local_2f0 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x1c00000000;
        local_368 = ZEXT816(0);
        local_358 = ZEXT816(0);
        local_348 = ZEXT816(0);
        local_338 = ZEXT816(0);
        local_328 = ZEXT816(0);
        local_318 = ZEXT816(0);
        local_308[0] = 0;
        local_308[1] = 0;
        stack0xfffffffffffffd00 = 0;
        uStack_2fb = 0;
        iStack_2f8 = 0;
        bStack_2f4 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_368,&local_1b8,&local_238);
        pnVar5 = extraout_RAX;
        if (((fpclass_type)local_2f0 != cpp_dec_float_NaN) &&
           (pnVar5 = __return_storage_ptr__,
           (__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) {
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_368,
                             &__return_storage_ptr__->m_backend);
          pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)CONCAT44(extraout_var_00,iVar4);
          if (0 < iVar4) {
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)local_368;
            pnVar5 = __return_storage_ptr__;
            for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar5->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar17 * -8 + 4);
              pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)((long)pnVar5 + ((ulong)bVar17 * -2 + 1) * 4);
            }
            (__return_storage_ptr__->m_backend).exp = iStack_2f8;
            (__return_storage_ptr__->m_backend).neg = bStack_2f4;
            *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              **)&(__return_storage_ptr__->m_backend).fpclass = local_2f0;
            pnVar5 = local_2f0;
          }
        }
      }
      else {
        iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_238,(cpp_dec_float<200U,_int,_void> *)local_368);
        pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(extraout_var,iVar4);
        if (iVar4 != 0) goto LAB_00149941;
      }
      local_2c8 = local_2c8 + 1;
    } while (local_2c8 != local_2e0);
  }
  return pnVar5;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}